

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::
rangeToString<std::pair<Numbers,std::basic_string_view<char,std::char_traits<char>>>const*,std::pair<Numbers,std::basic_string_view<char,std::char_traits<char>>>const*>
          (string *__return_storage_ptr__,Detail *this,
          pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *first,
          pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *last)

{
  ReusableStringStream *this_00;
  pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *e;
  pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *e_00;
  string local_88;
  string local_68;
  undefined1 local_38 [8];
  ReusableStringStream rss;
  pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *last_local;
  pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *first_local;
  
  rss.m_oss = (ostream *)first;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_38);
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(char (*) [3])"{ ");
  if (this != (Detail *)rss.m_oss) {
    stringify<std::pair<Numbers,std::basic_string_view<char,std::char_traits<char>>>>
              (&local_68,this,e);
    ReusableStringStream::operator<<((ReusableStringStream *)local_38,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    for (last_local = (pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      (this + 0x18);
        last_local !=
        (pair<Numbers,_std::basic_string_view<char,_std::char_traits<char>_>_> *)rss.m_oss;
        last_local = last_local + 1) {
      this_00 = ReusableStringStream::operator<<
                          ((ReusableStringStream *)local_38,(char (*) [3])", ");
      stringify<std::pair<Numbers,std::basic_string_view<char,std::char_traits<char>>>>
                (&local_88,(Detail *)last_local,e_00);
      ReusableStringStream::operator<<(this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(char (*) [3])" }");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_38);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }